

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

int reportComment(XML_Parser parser,ENCODING *enc,char *start,char *end)

{
  XML_Char *s;
  int iVar1;
  
  if (*(long *)((long)parser + 0x88) == 0) {
    iVar1 = 1;
    if (*(long *)((long)parser + 0xa0) != 0) {
      reportDefault(parser,enc,start,end);
    }
  }
  else {
    s = poolStoreString((STRING_POOL *)((long)parser + 0x418),enc,
                        start + (long)enc->minBytesPerChar * 4,end + (long)enc->minBytesPerChar * -3
                       );
    if (s == (XML_Char *)0x0) {
      iVar1 = 0;
    }
    else {
      normalizeLines(s);
      (**(code **)((long)parser + 0x88))(*(undefined8 *)((long)parser + 8),s);
      poolClear((STRING_POOL *)((long)parser + 0x418));
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int
reportComment(XML_Parser parser, const ENCODING *enc, const char *start, const char *end)
{
  XML_Char *data;
  if (!commentHandler) {
    if (defaultHandler)
      reportDefault(parser, enc, start, end);
    return 1;
  }
  data = poolStoreString(&tempPool,
                         enc,
                         start + enc->minBytesPerChar * 4, 
                         end - enc->minBytesPerChar * 3);
  if (!data)
    return 0;
  normalizeLines(data);
  commentHandler(handlerArg, data);
  poolClear(&tempPool);
  return 1;
}